

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_handler.c
# Opt level: O1

void ngx_stream_init_connection(ngx_connection_t *c)

{
  ngx_queue_t *pnVar1;
  sockaddr *psVar2;
  int *piVar3;
  undefined8 *puVar4;
  ngx_buf_t *pnVar5;
  void *pvVar6;
  ngx_uint_t *pnVar7;
  ngx_event_t *ev;
  ngx_time_t *pnVar8;
  ngx_int_t nVar9;
  ngx_stream_session_t *s;
  size_t sVar10;
  void **ppvVar11;
  ngx_stream_variable_value_t *pnVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  ngx_log_t *pnVar17;
  char *pcVar18;
  long *plVar19;
  undefined1 auVar20 [16];
  u_char local_a8 [8];
  u_char text [113];
  
  plVar19 = (long *)c->listening->servers;
  if ((ulong)plVar19[1] < 2) {
    if (c->local_sockaddr->sa_family == 10) {
      plVar19 = (long *)(*plVar19 + 0x10);
    }
    else {
      plVar19 = (long *)(*plVar19 + 8);
    }
  }
  else {
    nVar9 = ngx_connection_local_sockaddr(c,(ngx_str_t *)0x0,0);
    if (nVar9 != 0) goto LAB_0018ad8f;
    psVar2 = c->local_sockaddr;
    piVar3 = (int *)*plVar19;
    lVar13 = plVar19[1] + -1;
    if (psVar2->sa_family == 10) {
      lVar14 = 0;
      lVar15 = lVar14;
      if (lVar13 != 0) {
        piVar16 = piVar3;
        do {
          auVar20[0] = -((char)*piVar16 == psVar2->sa_data[6]);
          auVar20[1] = -(*(char *)((long)piVar16 + 1) == psVar2->sa_data[7]);
          auVar20[2] = -(*(char *)((long)piVar16 + 2) == psVar2->sa_data[8]);
          auVar20[3] = -(*(char *)((long)piVar16 + 3) == psVar2->sa_data[9]);
          auVar20[4] = -((char)piVar16[1] == psVar2->sa_data[10]);
          auVar20[5] = -(*(char *)((long)piVar16 + 5) == psVar2->sa_data[0xb]);
          auVar20[6] = -(*(char *)((long)piVar16 + 6) == psVar2->sa_data[0xc]);
          auVar20[7] = -(*(char *)((long)piVar16 + 7) == psVar2->sa_data[0xd]);
          auVar20[8] = -((char)piVar16[2] == (char)psVar2[1].sa_family);
          auVar20[9] = -(*(char *)((long)piVar16 + 9) == *(char *)((long)&psVar2[1].sa_family + 1));
          auVar20[10] = -(*(char *)((long)piVar16 + 10) == psVar2[1].sa_data[0]);
          auVar20[0xb] = -(*(char *)((long)piVar16 + 0xb) == psVar2[1].sa_data[1]);
          auVar20[0xc] = -((char)piVar16[3] == psVar2[1].sa_data[2]);
          auVar20[0xd] = -(*(char *)((long)piVar16 + 0xd) == psVar2[1].sa_data[3]);
          auVar20[0xe] = -(*(char *)((long)piVar16 + 0xe) == psVar2[1].sa_data[4]);
          auVar20[0xf] = -(*(char *)((long)piVar16 + 0xf) == psVar2[1].sa_data[5]);
          lVar15 = lVar14;
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar20[0xf] >> 7) << 0xf) == 0xffff) break;
          lVar14 = lVar14 + 1;
          piVar16 = piVar16 + 0xc;
          lVar15 = lVar13;
        } while (lVar13 != lVar14);
      }
      plVar19 = (long *)(piVar3 + lVar15 * 0xc + 4);
    }
    else {
      if (lVar13 == 0) {
        lVar15 = 0;
      }
      else {
        lVar14 = 0;
        piVar16 = piVar3;
        do {
          lVar15 = lVar14;
          if (*piVar16 == *(int *)(psVar2->sa_data + 2)) break;
          lVar14 = lVar14 + 1;
          piVar16 = piVar16 + 10;
          lVar15 = lVar13;
        } while (lVar13 != lVar14);
      }
      plVar19 = (long *)(piVar3 + lVar15 * 10 + 2);
    }
  }
  s = (ngx_stream_session_t *)ngx_pcalloc(c->pool,0x90);
  if (s != (ngx_stream_session_t *)0x0) {
    s->signature = 0x4d525453;
    puVar4 = (undefined8 *)*plVar19;
    s->main_conf = (void **)*puVar4;
    ppvVar11 = (void **)puVar4[1];
    s->srv_conf = ppvVar11;
    pnVar5 = c->buffer;
    if (pnVar5 != (ngx_buf_t *)0x0) {
      s->received = (off_t)(pnVar5->last + (s->received - (long)pnVar5->pos));
    }
    s->connection = c;
    c->data = s;
    pvVar6 = ppvVar11[ngx_stream_core_module.ctx_index];
    pnVar7 = *(ngx_uint_t **)((long)pvVar6 + 0x38);
    pnVar17 = c->log;
    pnVar17->file = (ngx_open_file_t *)pnVar7[1];
    pnVar17->next = (ngx_log_t *)pnVar7[9];
    pnVar17->writer = (ngx_log_writer_pt)pnVar7[6];
    pnVar17->wdata = (void *)pnVar7[7];
    if ((pnVar17->log_level & 0x80000000) == 0) {
      pnVar17->log_level = *pnVar7;
    }
    sVar10 = ngx_sock_ntop(c->sockaddr,c->socklen,local_a8,0x71,1);
    if (6 < c->log->log_level) {
      pcVar18 = "";
      if (c->type == 2) {
        pcVar18 = "udp ";
      }
      ngx_log_error_core(7,c->log,0,"*%uA %sclient %*s connected to %V",c->number,pcVar18,sVar10,
                         local_a8,plVar19 + 1);
    }
    pnVar17 = c->log;
    pnVar17->connection = c->number;
    pnVar17->handler = ngx_stream_log_error;
    pnVar17->data = s;
    pnVar17->action = "initializing session";
    *(uint *)&c->field_0xd8 = *(uint *)&c->field_0xd8 & 0xfffff8ff | 0x200;
    ppvVar11 = (void **)ngx_pcalloc(c->pool,ngx_stream_max_module << 3);
    s->ctx = ppvVar11;
    if (ppvVar11 != (void **)0x0) {
      pnVar12 = (ngx_stream_variable_value_t *)
                ngx_pcalloc(s->connection->pool,
                            *(long *)((long)s->main_conf[ngx_stream_core_module.ctx_index] + 0x70)
                            << 4);
      s->variables = pnVar12;
      pnVar8 = ngx_cached_time;
      if (pnVar12 != (ngx_stream_variable_value_t *)0x0) {
        s->start_sec = ngx_cached_time->sec;
        s->start_msec = pnVar8->msec;
        ev = c->read;
        ev->handler = ngx_stream_session_handler;
        if ((*(byte *)(plVar19 + 3) & 2) != 0) {
          c->log->action = "reading PROXY protocol";
          ev->handler = ngx_stream_proxy_protocol_handler;
          if ((ev->field_0x8 & 0x20) == 0) {
            ngx_event_add_timer(ev,*(ngx_msec_t *)((long)pvVar6 + 0x50));
            nVar9 = ngx_handle_read_event(ev,0);
            if (nVar9 == 0) {
              return;
            }
            ngx_stream_finalize_session(s,500);
            return;
          }
        }
        if (ngx_use_accept_mutex != 0) {
          if ((short)*(uint *)&ev->field_0x8 < 0) {
            pnVar17 = ev->log;
            if ((pnVar17->log_level & 0x10) == 0) {
              return;
            }
            pcVar18 = "update posted event %p";
          }
          else {
            *(uint *)&ev->field_0x8 = *(uint *)&ev->field_0x8 | 0x8000;
            pnVar1 = &ev->queue;
            (ev->queue).prev = ngx_posted_events.prev;
            (ngx_posted_events.prev)->next = pnVar1;
            (ev->queue).next = &ngx_posted_events;
            pnVar17 = ev->log;
            if ((pnVar17->log_level & 0x10) == 0) {
              ngx_posted_events.prev = pnVar1;
              return;
            }
            pcVar18 = "post event %p";
            ngx_posted_events.prev = pnVar1;
          }
          ngx_log_error_core(8,pnVar17,0,pcVar18,ev);
          return;
        }
        (*ev->handler)(ev);
        return;
      }
    }
    ngx_stream_close_connection(c);
    return;
  }
LAB_0018ad8f:
  ngx_stream_close_connection(c);
  return;
}

Assistant:

void
ngx_stream_init_connection(ngx_connection_t *c)
{
    u_char                        text[NGX_SOCKADDR_STRLEN];
    size_t                        len;
    ngx_uint_t                    i;
    ngx_time_t                   *tp;
    ngx_event_t                  *rev;
    struct sockaddr              *sa;
    ngx_stream_port_t            *port;
    struct sockaddr_in           *sin;
    ngx_stream_in_addr_t         *addr;
    ngx_stream_session_t         *s;
    ngx_stream_addr_conf_t       *addr_conf;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6          *sin6;
    ngx_stream_in6_addr_t        *addr6;
#endif
    ngx_stream_core_srv_conf_t   *cscf;
    ngx_stream_core_main_conf_t  *cmcf;

    /* find the server configuration for the address:port */

    port = c->listening->servers;

    if (port->naddrs > 1) {

        /*
         * There are several addresses on this port and one of them
         * is the "*:port" wildcard so getsockname() is needed to determine
         * the server address.
         *
         * AcceptEx() and recvmsg() already gave this address.
         */

        if (ngx_connection_local_sockaddr(c, NULL, 0) != NGX_OK) {
            ngx_stream_close_connection(c);
            return;
        }

        sa = c->local_sockaddr;

        switch (sa->sa_family) {

#if (NGX_HAVE_INET6)
        case AF_INET6:
            sin6 = (struct sockaddr_in6 *) sa;

            addr6 = port->addrs;

            /* the last address is "*" */

            for (i = 0; i < port->naddrs - 1; i++) {
                if (ngx_memcmp(&addr6[i].addr6, &sin6->sin6_addr, 16) == 0) {
                    break;
                }
            }

            addr_conf = &addr6[i].conf;

            break;
#endif

        default: /* AF_INET */
            sin = (struct sockaddr_in *) sa;

            addr = port->addrs;

            /* the last address is "*" */

            for (i = 0; i < port->naddrs - 1; i++) {
                if (addr[i].addr == sin->sin_addr.s_addr) {
                    break;
                }
            }

            addr_conf = &addr[i].conf;

            break;
        }

    } else {
        switch (c->local_sockaddr->sa_family) {

#if (NGX_HAVE_INET6)
        case AF_INET6:
            addr6 = port->addrs;
            addr_conf = &addr6[0].conf;
            break;
#endif

        default: /* AF_INET */
            addr = port->addrs;
            addr_conf = &addr[0].conf;
            break;
        }
    }

    s = ngx_pcalloc(c->pool, sizeof(ngx_stream_session_t));
    if (s == NULL) {
        ngx_stream_close_connection(c);
        return;
    }

    s->signature = NGX_STREAM_MODULE;
    s->main_conf = addr_conf->ctx->main_conf;
    s->srv_conf = addr_conf->ctx->srv_conf;

#if (NGX_STREAM_SSL)
    s->ssl = addr_conf->ssl;
#endif

    if (c->buffer) {
        s->received += c->buffer->last - c->buffer->pos;
    }

    s->connection = c;
    c->data = s;

    cscf = ngx_stream_get_module_srv_conf(s, ngx_stream_core_module);

    ngx_set_connection_log(c, cscf->error_log);

    len = ngx_sock_ntop(c->sockaddr, c->socklen, text, NGX_SOCKADDR_STRLEN, 1);

    ngx_log_error(NGX_LOG_INFO, c->log, 0, "*%uA %sclient %*s connected to %V",
                  c->number, c->type == SOCK_DGRAM ? "udp " : "",
                  len, text, &addr_conf->addr_text);

    c->log->connection = c->number;
    c->log->handler = ngx_stream_log_error;
    c->log->data = s;
    c->log->action = "initializing session";
    c->log_error = NGX_ERROR_INFO;

    s->ctx = ngx_pcalloc(c->pool, sizeof(void *) * ngx_stream_max_module);
    if (s->ctx == NULL) {
        ngx_stream_close_connection(c);
        return;
    }

    cmcf = ngx_stream_get_module_main_conf(s, ngx_stream_core_module);

    s->variables = ngx_pcalloc(s->connection->pool,
                               cmcf->variables.nelts
                               * sizeof(ngx_stream_variable_value_t));

    if (s->variables == NULL) {
        ngx_stream_close_connection(c);
        return;
    }

    tp = ngx_timeofday();
    s->start_sec = tp->sec;
    s->start_msec = tp->msec;

    rev = c->read;
    rev->handler = ngx_stream_session_handler;

    if (addr_conf->proxy_protocol) {
        c->log->action = "reading PROXY protocol";

        rev->handler = ngx_stream_proxy_protocol_handler;

        if (!rev->ready) {
            ngx_add_timer(rev, cscf->proxy_protocol_timeout);

            if (ngx_handle_read_event(rev, 0) != NGX_OK) {
                ngx_stream_finalize_session(s,
                                            NGX_STREAM_INTERNAL_SERVER_ERROR);
            }

            return;
        }
    }

    if (ngx_use_accept_mutex) {
        ngx_post_event(rev, &ngx_posted_events);
        return;
    }

    rev->handler(rev);
}